

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrologEncoderMD.cpp
# Opt level: O0

size_t PrologEncoderMD::GetAllocaSize(Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  RegNum RVar3;
  undefined4 *puVar4;
  Opnd *pOVar5;
  RegOpnd *this;
  IntConstOpnd *pIVar6;
  long lVar7;
  size_t sVar8;
  Instr *instr_local;
  
  if (instr->m_opcode != SUB) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x66,"(instr->m_opcode == Js::OpCode::SUB)",
                       "instr->m_opcode == Js::OpCode::SUB");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pOVar5 = IR::Instr::GetSrc1(instr);
  if (pOVar5 == (Opnd *)0x0) {
LAB_0087d025:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x67,"(instr->GetSrc1() && instr->GetSrc2())",
                       "instr->GetSrc1() && instr->GetSrc2()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  else {
    pOVar5 = IR::Instr::GetSrc2(instr);
    if (pOVar5 == (Opnd *)0x0) goto LAB_0087d025;
  }
  pOVar5 = IR::Instr::GetSrc1(instr);
  this = IR::Opnd::AsRegOpnd(pOVar5);
  RVar3 = IR::RegOpnd::GetReg(this);
  if (RVar3 == RegRSP) {
    pOVar5 = IR::Instr::GetSrc2(instr);
    bVar2 = IR::Opnd::IsIntConstOpnd(pOVar5);
    if (bVar2) goto LAB_0087d135;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                     ,0x69,
                     "(instr->GetSrc1()->AsRegOpnd()->GetReg() == RegRSP && instr->GetSrc2()->IsIntConstOpnd())"
                     ,
                     "instr->GetSrc1()->AsRegOpnd()->GetReg() == RegRSP && instr->GetSrc2()->IsIntConstOpnd()"
                    );
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 0;
LAB_0087d135:
  pOVar5 = IR::Instr::GetSrc2(instr);
  pIVar6 = IR::Opnd::AsIntConstOpnd(pOVar5);
  lVar7 = IR::EncodableOpnd<long>::GetValue(&pIVar6->super_EncodableOpnd<long>);
  if (lVar7 % 8 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x6a,"(instr->GetSrc2()->AsIntConstOpnd()->GetValue() % 8 == 0)",
                       "instr->GetSrc2()->AsIntConstOpnd()->GetValue() % 8 == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pOVar5 = IR::Instr::GetSrc2(instr);
  pIVar6 = IR::Opnd::AsIntConstOpnd(pOVar5);
  sVar8 = IR::EncodableOpnd<long>::GetValue(&pIVar6->super_EncodableOpnd<long>);
  return sVar8;
}

Assistant:

size_t PrologEncoderMD::GetAllocaSize(IR::Instr *instr)
{
    Assert(instr->m_opcode == Js::OpCode::SUB);
    Assert(instr->GetSrc1() && instr->GetSrc2());
    Assert(instr->GetSrc1()->AsRegOpnd()->GetReg() == RegRSP &&
           instr->GetSrc2()->IsIntConstOpnd());
    Assert(instr->GetSrc2()->AsIntConstOpnd()->GetValue() % 8 == 0);

    return instr->GetSrc2()->AsIntConstOpnd()->GetValue();
}